

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * extractFileName2(string *__return_storage_ptr__,string *src,bool withExt)

{
  long lVar1;
  long lVar2;
  char cVar3;
  string local_40 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  cVar3 = (char)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::rfind(cVar3,0x2e);
  lVar2 = std::__cxx11::string::rfind(cVar3,0x2f);
  if (lVar2 == -1) {
    lVar2 = std::__cxx11::string::rfind(cVar3,0x5c);
  }
  if (lVar1 != -1 && !withExt) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_40);
    std::__cxx11::string::~string(local_40);
  }
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileName2(const string& src, const bool withExt)
{
    string fileName = src;

    const size_t extSep = fileName.find_last_of('.');
    size_t dirSep = fileName.find_last_of('/');

    if (dirSep == string::npos)
        dirSep = fileName.find_last_of('\\');

    if (extSep != string::npos && !withExt)
        fileName = fileName.substr(0, extSep);

    if (dirSep != string::npos)
        fileName = fileName.substr(dirSep + 1, fileName.size());

    return fileName;
}